

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.cpp
# Opt level: O0

int __thiscall FIX::Dictionary::getInt(Dictionary *this,string *key)

{
  signed_int sVar1;
  FieldConvertError *anon_var_0;
  string local_38;
  string *local_18;
  string *key_local;
  Dictionary *this_local;
  
  local_18 = key;
  key_local = (string *)this;
  getString(&local_38,this,key,false);
  sVar1 = IntConvertor::convert(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return sVar1;
}

Assistant:

int Dictionary::getInt( const std::string& key ) const
EXCEPT ( ConfigError, FieldConvertError )
{
  try
  {
    return IntConvertor::convert( getString(key) );
  }
  catch ( FieldConvertError& )
  {
    throw ConfigError( "Illegal value " + getString(key) + " for " + key );
  }
}